

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O3

void Iso_ManObjCount(Aig_Man_t *p,Aig_Obj_t *pObj,int *pnNodes,int *pnEdges)

{
  if (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7) {
    *pnEdges = 0;
    *pnNodes = 0;
    Aig_ManIncrementTravId(p);
    Iso_ManObjCount_rec(p,pObj,pnNodes,pnEdges);
    return;
  }
  __assert_fail("Aig_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigIsoSlow.c"
                ,0x198,"void Iso_ManObjCount(Aig_Man_t *, Aig_Obj_t *, int *, int *)");
}

Assistant:

void Iso_ManObjCount( Aig_Man_t * p, Aig_Obj_t * pObj, int * pnNodes, int * pnEdges )
{
    assert( Aig_ObjIsNode(pObj) );
    *pnNodes = *pnEdges = 0;
    Aig_ManIncrementTravId( p );
    Iso_ManObjCount_rec( p, pObj, pnNodes, pnEdges );
}